

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O0

int __thiscall
cmGeneratedFileStreamBase::CompressFile(cmGeneratedFileStreamBase *this,char *oldname,char *newname)

{
  char *pcVar1;
  int iVar2;
  FILE *pFVar3;
  size_t sVar4;
  undefined1 local_488 [8];
  char buffer [1024];
  size_t BUFFER_SIZE;
  size_t res;
  allocator local_59;
  string local_58;
  FILE *local_38;
  FILE *ifs;
  gzFile gf;
  char *newname_local;
  char *oldname_local;
  cmGeneratedFileStreamBase *this_local;
  
  gf = newname;
  newname_local = oldname;
  oldname_local = (char *)this;
  ifs = (FILE *)cm_zlib_gzopen(newname,"w");
  pcVar1 = newname_local;
  if (ifs != (FILE *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,pcVar1,&local_59);
    pFVar3 = (FILE *)cmsys::SystemTools::Fopen(&local_58,"r");
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    local_38 = pFVar3;
    if (pFVar3 != (FILE *)0x0) {
      do {
        sVar4 = fread(local_488,1,0x400,local_38);
        if (sVar4 == 0) {
          fclose(local_38);
          cm_zlib_gzclose(ifs);
          return 1;
        }
        iVar2 = cm_zlib_gzwrite(ifs,local_488,(uint)sVar4);
      } while (iVar2 != 0);
      fclose(local_38);
      cm_zlib_gzclose(ifs);
    }
  }
  return 0;
}

Assistant:

int cmGeneratedFileStreamBase::CompressFile(const char* oldname,
                                            const char* newname)
{
  gzFile gf = gzopen(newname, "w");
  if (!gf) {
    return 0;
  }
  FILE* ifs = cmsys::SystemTools::Fopen(oldname, "r");
  if (!ifs) {
    return 0;
  }
  size_t res;
  const size_t BUFFER_SIZE = 1024;
  char buffer[BUFFER_SIZE];
  while ((res = fread(buffer, 1, BUFFER_SIZE, ifs)) > 0) {
    if (!gzwrite(gf, buffer, static_cast<int>(res))) {
      fclose(ifs);
      gzclose(gf);
      return 0;
    }
  }
  fclose(ifs);
  gzclose(gf);
  return 1;
}